

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O0

void nvrm_mmap(uint32_t id,uint32_t fd,uint64_t mmap_addr,uint64_t len,uint64_t mmap_offset)

{
  uint uVar1;
  mmt_fd_type mVar2;
  gpu_object *pgStack_38;
  uint32_t old_id;
  cpu_mapping *cpu_mapping;
  gpu_object *obj;
  uint64_t mmap_offset_local;
  uint64_t len_local;
  uint64_t mmap_addr_local;
  uint32_t fd_local;
  uint32_t id_local;
  
  cpu_mapping = (cpu_mapping *)gpu_objects;
  do {
    if (cpu_mapping == (cpu_mapping *)0x0) {
      if ((dump_sys_mmap != 0) && (fprintf(_stdout,"\n"), mmt_sync_fd != -1)) {
        fflush(_stdout);
      }
      mVar2 = demmt_get_fdtype(fd);
      if ((mVar2 == FDNVIDIA) &&
         (fprintf(_stdout,"ERROR: nvrm_mmap: couldn\'t find object/space offset: 0x%016lx\n",
                  mmap_offset), mmt_sync_fd != -1)) {
        fflush(_stdout);
      }
      buffer_mmap(id,fd,mmap_addr,len,mmap_offset);
      return;
    }
    for (pgStack_38 = cpu_mapping->object; pgStack_38 != (gpu_object *)0x0;
        pgStack_38 = (gpu_object *)(pgStack_38->written_regions).last) {
      if (pgStack_38->parent_object == (gpu_object *)mmap_offset) {
        pgStack_38->children_objects = (gpu_object **)mmap_addr;
        uVar1 = pgStack_38->fd;
        pgStack_38->fd = id;
        set_cpu_mapping(id,(cpu_mapping *)pgStack_38);
        if (dump_sys_mmap != 0) {
          if (pgStack_38->handle == FDNVIDIA) {
            fprintf(_stdout,", cid: 0x%08x, handle: 0x%08x",(ulong)(uint)cpu_mapping->fd,
                    (ulong)cpu_mapping->fdtype);
            describe_nvrm_object(cpu_mapping->fd,cpu_mapping->fdtype,"");
          }
          fprintf(_stdout,"\n");
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
        if ((uVar1 != 0) &&
           (fprintf(_stdout,"ERROR: %d -> %d, mapping reuse, expect crash soon\n",(ulong)uVar1,
                    (ulong)id), mmt_sync_fd != -1)) {
          fflush(_stdout);
        }
        if (pgStack_38->parent_object != (gpu_object *)0x0) {
          return;
        }
        pgStack_38->parent_object = (gpu_object *)0xffffffffffffffff;
        return;
      }
    }
    cpu_mapping = *(cpu_mapping **)&(cpu_mapping->ib).entries;
  } while( true );
}

Assistant:

void nvrm_mmap(uint32_t id, uint32_t fd, uint64_t mmap_addr, uint64_t len, uint64_t mmap_offset)
{
	struct gpu_object *obj;
	struct cpu_mapping *cpu_mapping;
	for (obj = gpu_objects; obj != NULL; obj = obj->next)
		for (cpu_mapping = obj->cpu_mappings; cpu_mapping != NULL; cpu_mapping = cpu_mapping->next)
			//can't validate fd
			if (cpu_mapping->mmap_offset == mmap_offset)
			{
				cpu_mapping->cpu_addr = mmap_addr;
				uint32_t old_id = cpu_mapping->id;
				cpu_mapping->id = id;
				set_cpu_mapping(id, cpu_mapping);

				if (dump_sys_mmap)
				{
					if (cpu_mapping->fdtype == FDNVIDIA)
					{
						mmt_log_cont(", cid: 0x%08x, handle: 0x%08x", obj->cid, obj->handle);
						describe_nvrm_object(obj->cid, obj->handle, "");
					}
					mmt_log_cont_nl();
				}
				if (old_id)
					mmt_error("%d -> %d, mapping reuse, expect crash soon\n", old_id, id);
				/*
				 * On newer blob, where mmap_offset is 0 for
				 * all mappings (WTF?), clobber the value to
				 * prevent the next nvrm_mmap from finding this
				 * mapping.
				 */
				if (cpu_mapping->mmap_offset == 0)
					cpu_mapping->mmap_offset = -1;
				return;
			}
	if (dump_sys_mmap)
		mmt_log_cont_nl();

	if (demmt_get_fdtype(fd) == FDNVIDIA)
		mmt_error("nvrm_mmap: couldn't find object/space offset: 0x%016" PRIx64 "\n", mmap_offset);

	buffer_mmap(id, fd, mmap_addr, len, mmap_offset);
}